

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldLabel_Test::TestBody
          (DescriptorTest_FieldLabel_Test *this)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  byte bVar3;
  Nonnull<const_char_*> pcVar4;
  undefined8 extraout_RAX;
  int iVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  FieldDescriptor *this_00;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  AssertHelper local_48;
  internal local_40 [8];
  undefined1 local_38 [12];
  undefined4 uStack_2c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_50.data_._0_4_ = 2;
  this_00 = (this->super_DescriptorTest).foo_;
  bVar2 = FieldDescriptor::is_required(this_00);
  iVar5 = 2;
  if (bVar2) {
LAB_005645d3:
    local_38._8_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
              (local_40,"FieldDescriptor::LABEL_REQUIRED","foo_->label()",(Label *)&local_50,
               (Label *)(local_38 + 8));
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)(local_38 + 8));
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_38._0_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x4ca,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)(local_38 + 8));
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT44(uStack_2c,local_38._8_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_2c,local_38._8_4_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_38._0_8_);
    }
    local_50.data_._0_4_ = 1;
    this_00 = (this->super_DescriptorTest).bar_;
    bVar2 = FieldDescriptor::is_required(this_00);
    iVar5 = 2;
    if (!bVar2) {
      bVar3 = this_00->field_0x1;
      bVar2 = (bool)((bVar3 & 0x20) >> 5);
      if (0xbf < bVar3 == bVar2) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                           (bVar2,0xbf < bVar3,
                            "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        iVar5 = (uint)((this_00->field_0x1 & 0x20) >> 5) * 2 + 1;
        goto LAB_005646d0;
      }
      goto LAB_005651fd;
    }
LAB_005646d0:
    local_38._8_4_ = iVar5;
    testing::internal::
    CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
              (local_40,"FieldDescriptor::LABEL_OPTIONAL","bar_->label()",(Label *)&local_50,
               (Label *)(local_38 + 8));
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)(local_38 + 8));
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_38._0_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x4cb,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)(local_38 + 8));
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT44(uStack_2c,local_38._8_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_2c,local_38._8_4_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_38._0_8_);
    }
    local_50.data_._0_4_ = 3;
    this_00 = (this->super_DescriptorTest).baz_;
    bVar2 = FieldDescriptor::is_required(this_00);
    iVar5 = 2;
    if (bVar2) {
LAB_005647cd:
      local_38._8_4_ = iVar5;
      testing::internal::
      CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                (local_40,"FieldDescriptor::LABEL_REPEATED","baz_->label()",(Label *)&local_50,
                 (Label *)(local_38 + 8));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)(local_38 + 8));
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar6 = ((_Alloc_hider *)local_38._0_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cc,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)(local_38 + 8));
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT44(uStack_2c,local_38._8_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(uStack_2c,local_38._8_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_38._0_8_);
      }
      local_50.data_._0_4_ = 1;
      this_00 = (this->super_DescriptorTest).moo_;
      bVar2 = FieldDescriptor::is_required(this_00);
      iVar5 = 2;
      if (!bVar2) {
        bVar3 = this_00->field_0x1;
        bVar2 = (bool)((bVar3 & 0x20) >> 5);
        if (0xbf < bVar3 == bVar2) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar2,0xbf < bVar3,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_00565217;
        iVar5 = (uint)((this_00->field_0x1 & 0x20) >> 5) * 2 + 1;
      }
      local_38._8_4_ = iVar5;
      testing::internal::
      CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                (local_40,"FieldDescriptor::LABEL_OPTIONAL","moo_->label()",(Label *)&local_50,
                 (Label *)(local_38 + 8));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)(local_38 + 8));
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar6 = ((_Alloc_hider *)local_38._0_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cd,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)(local_38 + 8));
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT44(uStack_2c,local_38._8_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(uStack_2c,local_38._8_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_38._0_8_);
      }
      local_40[0] = (internal)FieldDescriptor::is_required((this->super_DescriptorTest).foo_);
      local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_40[0]) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_38 + 8),local_40,(AssertionResult *)"foo_->is_required()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cf,(char *)CONCAT44(uStack_2c,local_38._8_4_));
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1);
        }
        if (local_50.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_38._0_8_);
      }
      local_40[0] = (internal)((((this->super_DescriptorTest).foo_)->field_0x1 & 0xc0) != 0x40);
      local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_40[0]) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_38 + 8),local_40,(AssertionResult *)"foo_->is_optional()","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4d0,(char *)CONCAT44(uStack_2c,local_38._8_4_));
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1);
        }
        if (local_50.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_38._0_8_);
      }
      this_00 = (this->super_DescriptorTest).foo_;
      bVar3 = this_00->field_0x1;
      bVar2 = (bool)((bVar3 & 0x20) >> 5);
      if (0xbf < bVar3 == bVar2) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                           (bVar2,0xbf < bVar3,
                            "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        bVar3 = this_00->field_0x1 & 0x20;
        local_40[0] = (internal)(bVar3 >> 5 ^ 1);
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar3 != 0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"foo_->is_repeated()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d1,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        bVar2 = FieldDescriptor::is_required((this->super_DescriptorTest).bar_);
        local_40[0] = (internal)!bVar2;
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"bar_->is_required()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d3,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        local_40[0] = (internal)((((this->super_DescriptorTest).bar_)->field_0x1 & 0xc0) == 0x40);
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"bar_->is_optional()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d4,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        this_00 = (this->super_DescriptorTest).bar_;
        bVar3 = this_00->field_0x1;
        bVar2 = (bool)((bVar3 & 0x20) >> 5);
        if (0xbf < bVar3 == bVar2) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar2,0xbf < bVar3,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_005651d6;
        bVar3 = this_00->field_0x1 & 0x20;
        local_40[0] = (internal)(bVar3 >> 5 ^ 1);
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar3 != 0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"bar_->is_repeated()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d5,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        bVar2 = FieldDescriptor::is_required((this->super_DescriptorTest).baz_);
        local_40[0] = (internal)!bVar2;
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"baz_->is_required()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d7,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        this_00 = (FieldDescriptor *)local_38;
        local_40[0] = (internal)((((this->super_DescriptorTest).baz_)->field_0x1 & 0xc0) != 0x40);
        local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)(local_38 + 8),local_40,(AssertionResult *)"baz_->is_optional()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d8,(char *)CONCAT44(uStack_2c,local_38._8_4_));
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1
                           );
          }
          if (local_50.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_38._0_8_);
        }
        pFVar1 = (this->super_DescriptorTest).baz_;
        bVar3 = pFVar1->field_0x1;
        bVar2 = (bool)((bVar3 & 0x20) >> 5);
        if (0xbf < bVar3 == bVar2) {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar2,0xbf < bVar3,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar4 == (Nonnull<const_char_*>)0x0) {
          bVar3 = pFVar1->field_0x1 & 0x20;
          local_40[0] = (internal)(bVar3 >> 5);
          local_38._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar3 == 0) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)(local_38 + 8),local_40,(AssertionResult *)"baz_->is_repeated()",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x4d9,(char *)CONCAT44(uStack_2c,local_38._8_4_));
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(uStack_2c,local_38._8_4_),
                              local_20._M_allocated_capacity + 1);
            }
            if (local_50.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_50.data_ + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38._0_8_);
          }
          return;
        }
      }
      else {
        TestBody();
LAB_005651d6:
        TestBody();
      }
      TestBody();
      goto LAB_005651f0;
    }
    bVar3 = this_00->field_0x1;
    bVar2 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar2) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar2,0xbf < bVar3,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      iVar5 = (uint)((this_00->field_0x1 & 0x20) >> 5) * 2 + 1;
      goto LAB_005647cd;
    }
  }
  else {
    bVar3 = this_00->field_0x1;
    bVar2 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar2) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar2,0xbf < bVar3,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      iVar5 = (uint)((this_00->field_0x1 & 0x20) >> 5) * 2 + 1;
      goto LAB_005645d3;
    }
LAB_005651f0:
    TestBody();
LAB_005651fd:
    TestBody();
  }
  TestBody();
LAB_00565217:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_2c,local_38._8_4_) != &local_20) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_2c,local_38._8_4_),local_20._M_allocated_capacity + 1);
  }
  if (local_50.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_50.data_ + 8))();
  }
  local_50.data_ = (AssertHelperData *)0x0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_
                );
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(DescriptorTest, FieldLabel) {
  EXPECT_EQ(FieldDescriptor::LABEL_REQUIRED, foo_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, bar_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_REPEATED, baz_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, moo_->label());

  EXPECT_TRUE(foo_->is_required());
  EXPECT_FALSE(foo_->is_optional());
  EXPECT_FALSE(foo_->is_repeated());

  EXPECT_FALSE(bar_->is_required());
  EXPECT_TRUE(bar_->is_optional());
  EXPECT_FALSE(bar_->is_repeated());

  EXPECT_FALSE(baz_->is_required());
  EXPECT_FALSE(baz_->is_optional());
  EXPECT_TRUE(baz_->is_repeated());
}